

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# sglrGLContext.cpp
# Opt level: O0

void __thiscall sglr::GLContext::viewport(GLContext *this,int x,int y,int width,int height)

{
  code *pcVar1;
  int iVar2;
  int iVar3;
  int iVar4;
  MessageBuilder *pMVar5;
  undefined4 extraout_var;
  int *piVar6;
  MessageBuilder local_1b8;
  undefined1 local_38 [8];
  IVec2 offset;
  RenderContext *local_28;
  int local_20;
  int local_1c;
  int height_local;
  int width_local;
  int y_local;
  int x_local;
  GLContext *this_local;
  
  local_20 = height;
  local_1c = width;
  height_local = y;
  width_local = x;
  _y_local = this;
  tcu::Vector<int,_4>::Vector((Vector<int,_4> *)&offset,x,y,width,height);
  *(int (*) [2])(this->m_curViewport).m_data = offset.m_data;
  *(RenderContext **)((this->m_curViewport).m_data + 2) = local_28;
  getDrawOffset((GLContext *)local_38);
  if ((this->m_logFlags & 1) != 0) {
    tcu::TestLog::operator<<(&local_1b8,this->m_log,(BeginMessageToken *)&tcu::TestLog::Message);
    pMVar5 = tcu::MessageBuilder::operator<<(&local_1b8,(char (*) [12])"glViewport(");
    pMVar5 = tcu::MessageBuilder::operator<<(pMVar5,&width_local);
    pMVar5 = tcu::MessageBuilder::operator<<(pMVar5,(char (*) [3])0x2a4b1eb);
    pMVar5 = tcu::MessageBuilder::operator<<(pMVar5,&height_local);
    pMVar5 = tcu::MessageBuilder::operator<<(pMVar5,(char (*) [3])0x2a4b1eb);
    pMVar5 = tcu::MessageBuilder::operator<<(pMVar5,&local_1c);
    pMVar5 = tcu::MessageBuilder::operator<<(pMVar5,(char (*) [3])0x2a4b1eb);
    pMVar5 = tcu::MessageBuilder::operator<<(pMVar5,&local_20);
    pMVar5 = tcu::MessageBuilder::operator<<(pMVar5,(char (*) [3])0x2b7da8c);
    tcu::MessageBuilder::operator<<(pMVar5,(EndMessageToken *)&tcu::TestLog::EndMessage);
    tcu::MessageBuilder::~MessageBuilder(&local_1b8);
  }
  iVar4 = (*this->m_context->_vptr_RenderContext[3])();
  iVar3 = width_local;
  pcVar1 = *(code **)(CONCAT44(extraout_var,iVar4) + 0x1a00);
  piVar6 = tcu::Vector<int,_2>::x((Vector<int,_2> *)local_38);
  iVar2 = height_local;
  iVar4 = *piVar6;
  piVar6 = tcu::Vector<int,_2>::y((Vector<int,_2> *)local_38);
  (*pcVar1)(iVar3 + iVar4,iVar2 + *piVar6,local_1c,local_20);
  return;
}

Assistant:

void GLContext::viewport (int x, int y, int width, int height)
{
	m_curViewport = tcu::IVec4(x, y, width, height);
	tcu::IVec2 offset = getDrawOffset();

	// \note For clarity don't add the offset to log
	if ((m_logFlags & GLCONTEXT_LOG_CALLS) != 0)
		m_log << TestLog::Message << "glViewport(" << x << ", " << y << ", " << width << ", " << height << ");" << TestLog::EndMessage;
	m_context.getFunctions().viewport(x+offset.x(), y+offset.y(), width, height);
}